

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn_reader.c
# Opt level: O3

RNNModel * rnnoise_model_from_file(FILE *f)

{
  uint uVar1;
  int iVar2;
  RNNModel *model;
  DenseLayer *pDVar3;
  GRULayer *pGVar4;
  rnn_weight *prVar5;
  rnn_weight *prVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int in;
  uint local_5c;
  GRULayer *local_58;
  GRULayer *local_50;
  DenseLayer *local_48;
  DenseLayer *local_40;
  rnn_weight *local_38;
  
  iVar2 = __isoc99_fscanf(f,"rnnoise-nu model file version %d\n",&local_5c);
  if (((iVar2 == 1) && (local_5c == 1)) &&
     (model = (RNNModel *)calloc(1,0x60), model != (RNNModel *)0x0)) {
    pDVar3 = (DenseLayer *)calloc(1,0x20);
    if (pDVar3 != (DenseLayer *)0x0) {
      model->input_dense = pDVar3;
      pGVar4 = (GRULayer *)calloc(1,0x28);
      if (pGVar4 != (GRULayer *)0x0) {
        model->vad_gru = pGVar4;
        local_50 = (GRULayer *)calloc(1,0x28);
        if (local_50 != (GRULayer *)0x0) {
          model->noise_gru = local_50;
          local_58 = (GRULayer *)calloc(1,0x28);
          if (local_58 != (GRULayer *)0x0) {
            model->denoise_gru = local_58;
            local_40 = (DenseLayer *)calloc(1,0x20);
            if (local_40 != (DenseLayer *)0x0) {
              model->denoise_output = local_40;
              local_48 = (DenseLayer *)calloc(1,0x20);
              if (local_48 != (DenseLayer *)0x0) {
                model->vad_output = local_48;
                iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                if (local_5c < 0x81 && iVar2 == 1) {
                  pDVar3->nb_inputs = local_5c;
                  iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                  if (local_5c < 0x81 && iVar2 == 1) {
                    pDVar3->nb_neurons = local_5c;
                    model->input_dense_size = local_5c;
                    iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                    if (local_5c < 0x81 && iVar2 == 1) {
                      iVar2 = (uint)(local_5c == 2) * 2;
                      if (local_5c == 1) {
                        iVar2 = 1;
                      }
                      pDVar3->activation = iVar2;
                      iVar2 = pDVar3->nb_neurons;
                      sVar7 = (long)pDVar3->nb_inputs * (long)iVar2;
                      local_38 = (rnn_weight *)malloc(sVar7);
                      if (local_38 != (rnn_weight *)0x0) {
                        pDVar3->input_weights = local_38;
                        if (0 < (int)sVar7) {
                          lVar8 = 0;
                          do {
                            iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                            if (iVar2 != 1) goto LAB_00104c78;
                            local_38[lVar8] = (rnn_weight)local_5c;
                            lVar8 = lVar8 + 1;
                            iVar2 = pDVar3->nb_neurons;
                          } while (lVar8 < (long)pDVar3->nb_inputs * (long)iVar2);
                        }
                        prVar5 = (rnn_weight *)malloc((long)iVar2);
                        if (prVar5 != (rnn_weight *)0x0) {
                          pDVar3->bias = prVar5;
                          if (0 < iVar2) {
                            lVar8 = 0;
                            do {
                              iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                              if (iVar2 != 1) goto LAB_00104c78;
                              prVar5[lVar8] = (rnn_weight)local_5c;
                              lVar8 = lVar8 + 1;
                            } while (lVar8 < pDVar3->nb_neurons);
                          }
                          iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                          if (local_5c < 0x81 && iVar2 == 1) {
                            pGVar4->nb_inputs = local_5c;
                            iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                            if (local_5c < 0x81 && iVar2 == 1) {
                              pGVar4->nb_neurons = local_5c;
                              model->vad_gru_size = local_5c;
                              iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                              if (local_5c < 0x81 && iVar2 == 1) {
                                iVar2 = (uint)(local_5c == 2) * 2;
                                if (local_5c == 1) {
                                  iVar2 = 1;
                                }
                                pGVar4->activation = iVar2;
                                iVar2 = pGVar4->nb_inputs;
                                uVar1 = pGVar4->nb_neurons;
                                prVar5 = (rnn_weight *)malloc((long)(int)(iVar2 * uVar1 * 3));
                                if (prVar5 != (rnn_weight *)0x0) {
                                  pGVar4->input_weights = prVar5;
                                  iVar9 = uVar1 * 3;
                                  if (0 < iVar2 * iVar9) {
                                    lVar8 = 0;
                                    do {
                                      iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                      if (iVar2 != 1) goto LAB_00104c78;
                                      prVar5[lVar8] = (rnn_weight)local_5c;
                                      lVar8 = lVar8 + 1;
                                      uVar1 = pGVar4->nb_neurons;
                                      iVar9 = uVar1 * 3;
                                    } while (lVar8 < pGVar4->nb_inputs * iVar9);
                                  }
                                  local_38 = (rnn_weight *)(ulong)uVar1;
                                  prVar5 = (rnn_weight *)malloc((ulong)(iVar9 * uVar1));
                                  if (prVar5 != (rnn_weight *)0x0) {
                                    pGVar4->recurrent_weights = prVar5;
                                    prVar6 = local_38;
                                    if (iVar9 * uVar1 != 0) {
                                      uVar11 = 0;
                                      do {
                                        iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                        if (iVar2 != 1) goto LAB_00104c78;
                                        prVar5[uVar11] = (rnn_weight)local_5c;
                                        uVar11 = uVar11 + 1;
                                        uVar1 = pGVar4->nb_neurons;
                                        prVar6 = (rnn_weight *)(ulong)uVar1;
                                        iVar9 = uVar1 * 3;
                                      } while (uVar11 < iVar9 * uVar1);
                                    }
                                    prVar5 = (rnn_weight *)malloc((long)iVar9);
                                    if (prVar5 != (rnn_weight *)0x0) {
                                      pGVar4->bias = prVar5;
                                      if (0 < (int)prVar6) {
                                        lVar8 = 0;
                                        do {
                                          iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                          if (iVar2 != 1) goto LAB_00104c78;
                                          prVar5[lVar8] = (rnn_weight)local_5c;
                                          lVar8 = lVar8 + 1;
                                        } while (lVar8 < (long)pGVar4->nb_neurons * 3);
                                      }
                                      iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                      if (local_5c < 0x81 && iVar2 == 1) {
                                        local_50->nb_inputs = local_5c;
                                        iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                        if (local_5c < 0x81 && iVar2 == 1) {
                                          local_50->nb_neurons = local_5c;
                                          model->noise_gru_size = local_5c;
                                          iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                          if (local_5c < 0x81 && iVar2 == 1) {
                                            iVar2 = (uint)(local_5c == 2) * 2;
                                            if (local_5c == 1) {
                                              iVar2 = 1;
                                            }
                                            local_50->activation = iVar2;
                                            iVar2 = local_50->nb_inputs;
                                            iVar9 = local_50->nb_neurons;
                                            prVar5 = (rnn_weight *)malloc((long)(iVar2 * iVar9 * 3))
                                            ;
                                            if (prVar5 != (rnn_weight *)0x0) {
                                              local_50->input_weights = prVar5;
                                              iVar10 = iVar9 * 3;
                                              if (0 < iVar2 * iVar10) {
                                                lVar8 = 0;
                                                do {
                                                  iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                  if (iVar2 != 1) goto LAB_00104c78;
                                                  prVar5[lVar8] = (rnn_weight)local_5c;
                                                  lVar8 = lVar8 + 1;
                                                  iVar9 = local_50->nb_neurons;
                                                  iVar10 = iVar9 * 3;
                                                } while (lVar8 < local_50->nb_inputs * iVar10);
                                              }
                                              prVar5 = (rnn_weight *)
                                                       malloc((ulong)(uint)(iVar10 * iVar9));
                                              if (prVar5 != (rnn_weight *)0x0) {
                                                local_50->recurrent_weights = prVar5;
                                                if (iVar10 * iVar9 != 0) {
                                                  uVar11 = 0;
                                                  do {
                                                    iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                    if (iVar2 != 1) goto LAB_00104c78;
                                                    prVar5[uVar11] = (rnn_weight)local_5c;
                                                    uVar11 = uVar11 + 1;
                                                    iVar9 = local_50->nb_neurons;
                                                    iVar10 = iVar9 * 3;
                                                  } while (uVar11 < (uint)(iVar10 * iVar9));
                                                }
                                                prVar5 = (rnn_weight *)malloc((long)iVar10);
                                                if (prVar5 != (rnn_weight *)0x0) {
                                                  local_50->bias = prVar5;
                                                  if (0 < iVar9) {
                                                    lVar8 = 0;
                                                    do {
                                                      iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                      if (iVar2 != 1) goto LAB_00104c78;
                                                      prVar5[lVar8] = (rnn_weight)local_5c;
                                                      lVar8 = lVar8 + 1;
                                                    } while (lVar8 < (long)local_50->nb_neurons * 3)
                                                    ;
                                                  }
                                                  iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                  if (local_5c < 0x81 && iVar2 == 1) {
                                                    local_58->nb_inputs = local_5c;
                                                    iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                    if (local_5c < 0x81 && iVar2 == 1) {
                                                      local_58->nb_neurons = local_5c;
                                                      model->denoise_gru_size = local_5c;
                                                      iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                      if (local_5c < 0x81 && iVar2 == 1) {
                                                        iVar2 = (uint)(local_5c == 2) * 2;
                                                        if (local_5c == 1) {
                                                          iVar2 = 1;
                                                        }
                                                        local_58->activation = iVar2;
                                                        iVar2 = local_58->nb_inputs;
                                                        iVar9 = local_58->nb_neurons;
                                                        prVar5 = (rnn_weight *)
                                                                 malloc((long)(iVar2 * iVar9 * 3));
                                                        if (prVar5 != (rnn_weight *)0x0) {
                                                          local_58->input_weights = prVar5;
                                                          iVar10 = iVar9 * 3;
                                                          if (0 < iVar2 * iVar10) {
                                                            lVar8 = 0;
                                                            do {
                                                              iVar2 = __isoc99_fscanf(f,"%d",&
                                                  local_5c);
                                                  if (iVar2 != 1) goto LAB_00104c78;
                                                  prVar5[lVar8] = (rnn_weight)local_5c;
                                                  lVar8 = lVar8 + 1;
                                                  iVar9 = local_58->nb_neurons;
                                                  iVar10 = iVar9 * 3;
                                                  } while (lVar8 < local_58->nb_inputs * iVar10);
                                                  }
                                                  prVar5 = (rnn_weight *)
                                                           malloc((ulong)(uint)(iVar10 * iVar9));
                                                  if (prVar5 != (rnn_weight *)0x0) {
                                                    local_58->recurrent_weights = prVar5;
                                                    if (iVar10 * iVar9 != 0) {
                                                      uVar11 = 0;
                                                      do {
                                                        iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                        if (iVar2 != 1) goto LAB_00104c78;
                                                        prVar5[uVar11] = (rnn_weight)local_5c;
                                                        uVar11 = uVar11 + 1;
                                                        iVar9 = local_58->nb_neurons;
                                                        iVar10 = iVar9 * 3;
                                                      } while (uVar11 < (uint)(iVar10 * iVar9));
                                                    }
                                                    prVar5 = (rnn_weight *)malloc((long)iVar10);
                                                    if (prVar5 != (rnn_weight *)0x0) {
                                                      local_58->bias = prVar5;
                                                      if (0 < iVar9) {
                                                        lVar8 = 0;
                                                        do {
                                                          iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                          if (iVar2 != 1) goto LAB_00104c78;
                                                          prVar5[lVar8] = (rnn_weight)local_5c;
                                                          lVar8 = lVar8 + 1;
                                                        } while (lVar8 < (long)local_58->nb_neurons
                                                                         * 3);
                                                      }
                                                      iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                      if (local_5c < 0x81 && iVar2 == 1) {
                                                        local_40->nb_inputs = local_5c;
                                                        iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                        if (local_5c < 0x81 && iVar2 == 1) {
                                                          local_40->nb_neurons = local_5c;
                                                          model->denoise_output_size = local_5c;
                                                          iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                          if (local_5c < 0x81 && iVar2 == 1) {
                                                            iVar2 = (uint)(local_5c == 2) * 2;
                                                            if (local_5c == 1) {
                                                              iVar2 = 1;
                                                            }
                                                            local_40->activation = iVar2;
                                                            iVar2 = local_40->nb_neurons;
                                                            sVar7 = (long)local_40->nb_inputs *
                                                                    (long)iVar2;
                                                            prVar5 = (rnn_weight *)malloc(sVar7);
                                                            if (prVar5 != (rnn_weight *)0x0) {
                                                              local_40->input_weights = prVar5;
                                                              if (0 < (int)sVar7) {
                                                                lVar8 = 0;
                                                                do {
                                                                  iVar2 = __isoc99_fscanf(f,"%d",&
                                                  local_5c);
                                                  if (iVar2 != 1) goto LAB_00104c78;
                                                  prVar5[lVar8] = (rnn_weight)local_5c;
                                                  lVar8 = lVar8 + 1;
                                                  iVar2 = local_40->nb_neurons;
                                                  } while (lVar8 < (long)local_40->nb_inputs *
                                                                   (long)iVar2);
                                                  }
                                                  prVar5 = (rnn_weight *)malloc((long)iVar2);
                                                  if (prVar5 != (rnn_weight *)0x0) {
                                                    local_40->bias = prVar5;
                                                    if (0 < iVar2) {
                                                      lVar8 = 0;
                                                      do {
                                                        iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                        if (iVar2 != 1) goto LAB_00104c78;
                                                        prVar5[lVar8] = (rnn_weight)local_5c;
                                                        lVar8 = lVar8 + 1;
                                                      } while (lVar8 < local_40->nb_neurons);
                                                    }
                                                    iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                    if (local_5c < 0x81 && iVar2 == 1) {
                                                      local_48->nb_inputs = local_5c;
                                                      iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                      if (local_5c < 0x81 && iVar2 == 1) {
                                                        local_48->nb_neurons = local_5c;
                                                        model->vad_output_size = local_5c;
                                                        iVar2 = __isoc99_fscanf(f,"%d",&local_5c);
                                                        if (local_5c < 0x81 && iVar2 == 1) {
                                                          iVar2 = (uint)(local_5c == 2) * 2;
                                                          if (local_5c == 1) {
                                                            iVar2 = 1;
                                                          }
                                                          local_48->activation = iVar2;
                                                          iVar2 = local_48->nb_neurons;
                                                          sVar7 = (long)local_48->nb_inputs *
                                                                  (long)iVar2;
                                                          prVar5 = (rnn_weight *)malloc(sVar7);
                                                          if (prVar5 != (rnn_weight *)0x0) {
                                                            local_48->input_weights = prVar5;
                                                            if (0 < (int)sVar7) {
                                                              lVar8 = 0;
                                                              do {
                                                                iVar2 = __isoc99_fscanf(f,"%d",&
                                                  local_5c);
                                                  if (iVar2 != 1) goto LAB_00104c78;
                                                  prVar5[lVar8] = (rnn_weight)local_5c;
                                                  lVar8 = lVar8 + 1;
                                                  iVar2 = local_48->nb_neurons;
                                                  } while (lVar8 < (long)local_48->nb_inputs *
                                                                   (long)iVar2);
                                                  }
                                                  prVar5 = (rnn_weight *)malloc((long)iVar2);
                                                  if (prVar5 != (rnn_weight *)0x0) {
                                                    local_48->bias = prVar5;
                                                    if (iVar2 < 1) {
                                                      return model;
                                                    }
                                                    lVar8 = 0;
                                                    while (iVar2 = __isoc99_fscanf(f,"%d",&local_5c)
                                                          , iVar2 == 1) {
                                                      prVar5[lVar8] = (rnn_weight)local_5c;
                                                      lVar8 = lVar8 + 1;
                                                      if (local_48->nb_neurons <= lVar8) {
                                                        return model;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00104c78:
    rnnoise_model_free(model);
  }
  return (RNNModel *)0x0;
}

Assistant:

RNNModel *rnnoise_model_from_file(FILE *f) {
    int i, in;

    if (fscanf(f, "rnnoise-nu model file version %d\n", &in) != 1 || in != 1)
        return NULL;

    RNNModel *ret = calloc(1, sizeof(RNNModel));
    if (!ret)
        return NULL;

#define ALLOC_LAYER(type, name) \
    type *name; \
    name = calloc(1, sizeof(type)); \
    if (!name) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    ret->name = name

    ALLOC_LAYER(DenseLayer, input_dense);
    ALLOC_LAYER(GRULayer, vad_gru);
    ALLOC_LAYER(GRULayer, noise_gru);
    ALLOC_LAYER(GRULayer, denoise_gru);
    ALLOC_LAYER(DenseLayer, denoise_output);
    ALLOC_LAYER(DenseLayer, vad_output);

#define INPUT_VAL(name) do { \
    if (fscanf(f, "%d", &in) != 1 || in < 0 || in > 128) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = in; \
    } while (0)

#define INPUT_ACTIVATION(name) do { \
    int activation; \
    INPUT_VAL(activation); \
    switch (activation) { \
        case F_ACTIVATION_SIGMOID: \
            name = ACTIVATION_SIGMOID; \
            break; \
        case F_ACTIVATION_RELU: \
            name = ACTIVATION_RELU; \
            break; \
        default: \
            name = ACTIVATION_TANH; \
    } \
    } while (0)

#define INPUT_ARRAY(name, len) do { \
    rnn_weight *values = malloc((len) * sizeof(rnn_weight)); \
    if (!values) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = values; \
    for (i = 0; i < (len); i++) { \
        if (fscanf(f, "%d", &in) != 1) { \
            rnnoise_model_free(ret); \
            return NULL; \
        } \
        values[i] = in; \
    } \
    } while (0)

#define INPUT_DENSE(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons); \
    INPUT_ARRAY(name->bias, name->nb_neurons); \
    } while (0)

#define INPUT_GRU(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons * 3); \
    INPUT_ARRAY(name->recurrent_weights, name->nb_neurons * name->nb_neurons * 3); \
    INPUT_ARRAY(name->bias, name->nb_neurons * 3); \
    } while (0)

    INPUT_DENSE(input_dense);
    INPUT_GRU(vad_gru);
    INPUT_GRU(noise_gru);
    INPUT_GRU(denoise_gru);
    INPUT_DENSE(denoise_output);
    INPUT_DENSE(vad_output);

    return ret;
}